

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::GarbageCollector::allocateObjectMemory
          (GarbageCollector *this,size_t objectSize,bool bigObject)

{
  bool bVar1;
  VMHeap *pVVar2;
  long *plVar3;
  uint8_t *puVar4;
  ObjectHeader *header;
  AllocatedObject *allocatedObjectHeader;
  uint8_t *result;
  int extraHeaderSize;
  VMHeap *heap;
  unique_lock<std::mutex> l;
  bool bigObject_local;
  size_t objectSize_local;
  GarbageCollector *this_local;
  
  l._15_1_ = bigObject;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&heap,&this->controlMutex);
  pVVar2 = MemoryManager::getHeap(this->memoryManager);
  if (7 < objectSize) {
    bVar1 = VMHeap::hasCapacityThresholdBeenReached(pVVar2);
    if (!bVar1) {
      queueGarbageCollection(this);
    }
    result._0_4_ = 8;
    if ((l._15_1_ & 1) != 0) {
      result._0_4_ = 0x10;
    }
    pVVar2 = MemoryManager::getHeap(this->memoryManager);
    plVar3 = (long *)VMHeap::allocate(pVVar2,objectSize + (long)(int)result);
    *plVar3 = (long)(int)(uint)((l._15_1_ & 1) != 0);
    puVar4 = (uint8_t *)((long)plVar3 + (long)(int)result);
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4[4] = '\0';
    puVar4[5] = '\0';
    puVar4[6] = '\0';
    puVar4[7] = '\0';
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&heap);
    return puVar4;
  }
  __assert_fail("objectSize >= sizeof(ObjectHeader)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MemoryManager.cpp"
                ,0x13a,"uint8_t *Lodtalk::GarbageCollector::allocateObjectMemory(size_t, bool)");
}

Assistant:

uint8_t *GarbageCollector::allocateObjectMemory(size_t objectSize, bool bigObject)
{
    std::unique_lock<std::mutex> l(controlMutex);

    auto heap = memoryManager->getHeap();
	assert(objectSize >= sizeof(ObjectHeader));
    // Should I enqueue a garbage collection?
    if (!heap->hasCapacityThresholdBeenReached())
        queueGarbageCollection();

    // Add a forwarding slot, used by compaction.
    auto extraHeaderSize = 8;
    if(bigObject)
        extraHeaderSize += 8;

	// Allocate from the VM heap.
    auto result = memoryManager->getHeap()->allocate(objectSize + extraHeaderSize);
    auto allocatedObjectHeader = reinterpret_cast<AllocatedObject*> (result);
    allocatedObjectHeader->rawForwardingPointer = bigObject ? 1 : 0;
    result += extraHeaderSize;

	auto header = reinterpret_cast<ObjectHeader*> (result);
	*header = {0};

	return result;
}